

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::APITest2::iterate(APITest2 *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  char *description;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    initTest(this);
    verifyGLGetActiveSubroutineNameFunctionality(this);
    verifyGLGetActiveSubroutineUniformNameFunctionality(this);
    bVar1 = this->m_has_test_passed != true;
    if (bVar1) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,
               description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_ARB_shader_subroutine is not supported.",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult APITest2::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Initialize a test program object */
	initTest();

	/* Verify glGetActiveSubroutineName() works correctly */
	verifyGLGetActiveSubroutineNameFunctionality();

	/* Verify glGetActiveSubroutineUniformName() works correctly */
	verifyGLGetActiveSubroutineUniformNameFunctionality();

	/* Done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}